

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O0

void __thiscall
Assimp::ASE::Parser::ParseLV3MeshVertexListBlock(Parser *this,uint iNumVertices,Mesh *mesh)

{
  bool bVar1;
  reference pvVar2;
  uint local_34;
  undefined1 auStack_30 [4];
  uint iIndex;
  aiVector3D vTemp;
  int iDepth;
  Mesh *mesh_local;
  uint iNumVertices_local;
  Parser *this_local;
  
  vTemp.y = 0.0;
  unique0x10000193 = mesh;
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)mesh,
             (ulong)iNumVertices);
  do {
    while (*this->filePtr != '*') {
LAB_0061443e:
      if (*this->filePtr == '{') {
        vTemp.y = (float)((int)vTemp.y + 1);
      }
      else if (*this->filePtr == '}') {
        vTemp.y = (float)((int)vTemp.y + -1);
        if (vTemp.y == 0.0) {
          this->filePtr = this->filePtr + 1;
          SkipToNextToken(this);
          return;
        }
      }
      else if (*this->filePtr == '\0') {
        LogError(this,"Encountered unexpected EOL while parsing a *MESH_VERTEX_LIST chunk (Level 3)"
                );
      }
      bVar1 = IsLineEnd<char>(*this->filePtr);
      if ((bVar1) && ((this->bLastWasEndLine & 1U) == 0)) {
        this->iLineNumber = this->iLineNumber + 1;
        this->bLastWasEndLine = true;
      }
      else {
        this->bLastWasEndLine = false;
      }
      this->filePtr = this->filePtr + 1;
    }
    this->filePtr = this->filePtr + 1;
    bVar1 = TokenMatch<char_const>(&this->filePtr,"MESH_VERTEX",0xb);
    if (!bVar1) goto LAB_0061443e;
    aiVector3t<float>::aiVector3t((aiVector3t<float> *)auStack_30);
    ParseLV4MeshFloatTriple(this,(ai_real *)auStack_30,&local_34);
    if (local_34 < iNumVertices) {
      pvVar2 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                         ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                          stack0xffffffffffffffe0,(ulong)local_34);
      pvVar2->x = (float)auStack_30;
      pvVar2->y = (float)iIndex;
      pvVar2->z = vTemp.x;
    }
    else {
      LogWarning(this,"Invalid vertex index. It will be ignored");
    }
  } while( true );
}

Assistant:

void Parser::ParseLV3MeshVertexListBlock(
    unsigned int iNumVertices, ASE::Mesh& mesh)
{
    AI_ASE_PARSER_INIT();

    // allocate enough storage in the array
    mesh.mPositions.resize(iNumVertices);
    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;

            // Vertex entry
            if (TokenMatch(filePtr,"MESH_VERTEX" ,11))
            {

                aiVector3D vTemp;
                unsigned int iIndex;
                ParseLV4MeshFloatTriple(&vTemp.x,iIndex);

                if (iIndex >= iNumVertices)
                {
                    LogWarning("Invalid vertex index. It will be ignored");
                }
                else mesh.mPositions[iIndex] = vTemp;
                continue;
            }
        }
        AI_ASE_HANDLE_SECTION("3","*MESH_VERTEX_LIST");
    }
    return;
}